

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_output_preds(options_i *options,vw *all)

{
  long *plVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *__file;
  long in_RSI;
  long *in_RDI;
  int f_1;
  char *t;
  int f;
  char *fstr;
  option_group_definition output_options;
  string raw_predictions;
  string predictions;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbd8;
  option_group_definition *in_stack_fffffffffffffbe0;
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  int local_328;
  int local_324;
  char *local_320;
  undefined4 local_318;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [199];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [215];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [56];
  string local_50 [32];
  string local_30 [32];
  long local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Output options",&local_a9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb90,
             (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"predictions",&local_181);
  VW::config::make_option<std::__cxx11::string>
            ((string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"p",&local_1a9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name(in_stack_fffffffffffffb90,
             (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"File to output predictions to",&local_1d1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffffb90,
       (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"raw_predictions",&local_299);
  VW::config::make_option<std::__cxx11::string>
            ((string *)CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"r",&local_2c1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name(in_stack_fffffffffffffb90,
             (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"File to output unnormalized predictions to",&local_2e9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffffb90,
       (string *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  (**(code **)*local_8)(local_8,local_88);
  plVar1 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"predictions",&local_311);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_310);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  if ((bVar2 & 1) != 0) {
    if ((*(byte *)(local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0xe0),"predictions = ");
      poVar5 = std::operator<<(poVar5,local_30);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb90,
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar3) {
      local_318 = 1;
      v_array<int>::push_back
                ((v_array<int> *)in_stack_fffffffffffffb90,
                 (int *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
    else {
      local_320 = (char *)std::__cxx11::string::c_str();
      local_324 = open64(local_320,0x241,0x1b6);
      if (local_324 < 0) {
        poVar5 = std::operator<<((ostream *)(local_10 + 0xe0),"Error opening the predictions file: "
                                );
        poVar5 = std::operator<<(poVar5,local_320);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      local_328 = local_324;
      v_array<int>::push_back
                ((v_array<int> *)in_stack_fffffffffffffb90,
                 (int *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    }
  }
  plVar1 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"raw_predictions",&local_349);
  bVar2 = (**(code **)(*plVar1 + 8))(plVar1,local_348);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  if ((bVar2 & 1) != 0) {
    if ((*(byte *)(local_10 + 0x3439) & 1) == 0) {
      poVar5 = std::operator<<((ostream *)(local_10 + 0xe0),"raw predictions = ");
      poVar5 = std::operator<<(poVar5,local_50);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,"binary",&local_371);
      bVar2 = (**(code **)(*local_8 + 8))(local_8,local_370);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      if ((bVar2 & 1) != 0) {
        in_stack_fffffffffffffb90 =
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::operator<<((ostream *)(local_10 + 0xe0),
                                "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                               );
        std::ostream::operator<<(in_stack_fffffffffffffb90,std::endl<char,std::char_traits<char>>);
      }
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb90,
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar3) {
      *(undefined4 *)(local_10 + 0x3530) = 1;
    }
    else {
      __file = (char *)std::__cxx11::string::c_str();
      iVar4 = open64(__file,0x241,0x1b6);
      *(int *)(local_10 + 0x3530) = iVar4;
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void parse_output_preds(options_i& options, vw& all)
{
  std::string predictions;
  std::string raw_predictions;

  option_group_definition output_options("Output options");
  output_options.add(make_option("predictions", predictions).short_name("p").help("File to output predictions to"))
      .add(make_option("raw_predictions", raw_predictions)
               .short_name("r")
               .help("File to output unnormalized predictions to"));
  options.add_and_parse(output_options);

  if (options.was_supplied("predictions"))
  {
    if (!all.quiet)
      all.trace_message << "predictions = " << predictions << endl;

    if (predictions == "stdout")
    {
      all.final_prediction_sink.push_back((size_t)1);  // stdout
    }
    else
    {
      const char* fstr = predictions.c_str();
      int f;
      // TODO can we migrate files to fstreams?
#ifdef _WIN32
      _sopen_s(&f, fstr, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(fstr, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      if (f < 0)
        all.trace_message << "Error opening the predictions file: " << fstr << endl;
      all.final_prediction_sink.push_back((size_t)f);
    }
  }

  if (options.was_supplied("raw_predictions"))
  {
    if (!all.quiet)
    {
      all.trace_message << "raw predictions = " << raw_predictions << endl;
      if (options.was_supplied("binary"))
        all.trace_message << "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                          << endl;
    }
    if (raw_predictions == "stdout")
      all.raw_prediction = 1;  // stdout
    else
    {
      const char* t = raw_predictions.c_str();
      int f;
#ifdef _WIN32
      _sopen_s(&f, t, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(t, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      all.raw_prediction = f;
    }
  }
}